

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O3

string * __thiscall
ast::Dir_space::more_listing_abi_cxx11_(string *__return_storage_ptr__,Dir_space *this)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = (this->super_Directive).super_Statement.size_in_memory;
  if (uVar5 < 4) {
    if (1 < uVar5) {
      uVar5 = 1;
      do {
        uVar1 = (this->super_Directive).super_Statement.location.line;
        uVar4 = Sections::get_address((this->super_Directive).super_Statement.section_index);
        uVar2 = (this->super_Directive).super_Statement.section_offset;
        bVar3 = Sections::read8((this->super_Directive).super_Statement.section_index,uVar5 + uVar2)
        ;
        string_printf_abi_cxx11_
                  (&local_58,"%4d %04X %02X\n",(ulong)uVar1,(ulong)(uVar2 + uVar4 + uVar5),
                   (ulong)bVar3);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (this->super_Directive).super_Statement.size_in_memory);
    }
  }
  else {
    string_printf_abi_cxx11_
              (&local_58,"%4d .... ..\n",
               (ulong)(uint)(this->super_Directive).super_Statement.location.line);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    uVar5 = (this->super_Directive).super_Statement.location.line;
    uVar4 = Sections::get_address((this->super_Directive).super_Statement.section_index);
    uVar1 = (this->super_Directive).super_Statement.section_offset;
    uVar2 = (this->super_Directive).super_Statement.size_in_memory;
    bVar3 = Sections::read8((this->super_Directive).super_Statement.section_index,
                            (uVar2 + uVar1) - 1);
    string_printf_abi_cxx11_
              (&local_58,"%4d %04X %02X\n",(ulong)uVar5,(ulong)((uVar2 + uVar4 + uVar1) - 1),
               (ulong)bVar3);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Dir_space::more_listing()
{
	string tmp = {};
	if (size_in_memory <= 3)
		for (unsigned i = 1; i < size_in_memory; ++i) {
			tmp += string_printf("%4d %04X %02X\n", location.line,
				Sections::get_address(section_index) + section_offset + i,
				Sections::read8(section_index, section_offset + i));
		}
	else {
		tmp += string_printf("%4d .... ..\n", location.line);
		tmp += string_printf("%4d %04X %02X\n", location.line,
			Sections::get_address(section_index) + section_offset + size_in_memory - 1,
			Sections::read8(section_index, section_offset + size_in_memory - 1));
	}
	return tmp;
}